

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLInstanceKinematicsModelLoader.cpp
# Opt level: O1

bool __thiscall
COLLADASaxFWL::InstanceKinematicsModelLoader::begin__int(InstanceKinematicsModelLoader *this)

{
  KinematicsNewParam *pKVar1;
  
  pKVar1 = (KinematicsNewParam *)operator_new(0x38);
  pKVar1->_vptr_KinematicsNewParam = (_func_int **)&PTR__KinematicsNewParam_009dc7d8;
  pKVar1->mValueType = VALUETYPE_INT;
  (pKVar1->mName)._M_dataplus._M_p = (pointer)&(pKVar1->mName).field_2;
  (pKVar1->mName)._M_string_length = 0;
  (pKVar1->mName).field_2._M_local_buf[0] = '\0';
  (pKVar1->mValue)._int = 0;
  this->mCurrentKinematicsNewParam = pKVar1;
  std::__cxx11::string::_M_assign((string *)&pKVar1->mName);
  return true;
}

Assistant:

bool InstanceKinematicsModelLoader::begin__int()
	{
		mCurrentKinematicsNewParam = new KinematicsNewParam(KinematicsNewParam::VALUETYPE_INT);
		mCurrentKinematicsNewParam->setName(mCurrentKinematicsNewParamSid);
		return true;
	}